

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

S2Point * __thiscall
S2Polyline::GetSuffix
          (S2Point *__return_storage_ptr__,S2Polyline *this,double fraction,int *next_vertex)

{
  S1Angle ax_angle;
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  S2Point *pSVar5;
  S2Point *pSVar6;
  int local_104;
  S2Point *result;
  S1Angle local_88;
  S1Angle length;
  int i_1;
  S1Angle local_70;
  S1Angle target;
  int local_5c;
  S1Angle SStack_58;
  int i;
  S1Angle length_sum;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  int *local_20;
  int *next_vertex_local;
  double fraction_local;
  S2Polyline *this_local;
  
  local_20 = next_vertex;
  next_vertex_local = (int *)fraction;
  fraction_local = (double)this;
  iVar2 = num_vertices(this);
  if (iVar2 < 1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
               ,0xa9,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream(&local_38);
    poVar4 = std::operator<<(poVar4,"Check failed: (num_vertices()) > (0) ");
    S2LogMessageVoidify::operator&(&local_21,poVar4);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  if (0.0 < (double)next_vertex_local) {
    S1Angle::S1Angle(&stack0xffffffffffffffa8);
    for (local_5c = 1; iVar2 = num_vertices(this), local_5c < iVar2; local_5c = local_5c + 1) {
      pSVar5 = vertex(this,local_5c + -1);
      pSVar6 = vertex(this,local_5c);
      S1Angle::S1Angle(&target,pSVar5,pSVar6);
      S1Angle::operator+=(&stack0xffffffffffffffa8,target);
    }
    local_70 = ::operator*((double)next_vertex_local,SStack_58);
    for (length.radians_._4_4_ = 1; iVar2 = length.radians_._4_4_, iVar3 = num_vertices(this),
        iVar2 < iVar3; length.radians_._4_4_ = length.radians_._4_4_ + 1) {
      pSVar5 = vertex(this,length.radians_._4_4_ + -1);
      pSVar6 = vertex(this,length.radians_._4_4_);
      S1Angle::S1Angle(&local_88,pSVar5,pSVar6);
      bVar1 = ::operator<(local_70,local_88);
      ax_angle.radians_ = local_70.radians_;
      if (bVar1) {
        pSVar5 = vertex(this,length.radians_._4_4_ + -1);
        pSVar6 = vertex(this,length.radians_._4_4_);
        S2::InterpolateAtDistance(__return_storage_ptr__,ax_angle,pSVar5,pSVar6);
        pSVar5 = vertex(this,length.radians_._4_4_);
        bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          ((BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,pSVar5);
        if (bVar1) {
          local_104 = length.radians_._4_4_ + 1;
        }
        else {
          local_104 = length.radians_._4_4_;
        }
        *local_20 = local_104;
        return __return_storage_ptr__;
      }
      S1Angle::operator-=(&local_70,local_88);
    }
    iVar2 = num_vertices(this);
    *local_20 = iVar2;
    iVar2 = num_vertices(this);
    pSVar5 = vertex(this,iVar2 + -1);
    __return_storage_ptr__->c_[0] = pSVar5->c_[0];
    __return_storage_ptr__->c_[1] = pSVar5->c_[1];
    __return_storage_ptr__->c_[2] = pSVar5->c_[2];
  }
  else {
    *local_20 = 1;
    pSVar5 = vertex(this,0);
    __return_storage_ptr__->c_[0] = pSVar5->c_[0];
    __return_storage_ptr__->c_[1] = pSVar5->c_[1];
    __return_storage_ptr__->c_[2] = pSVar5->c_[2];
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Polyline::GetSuffix(double fraction, int* next_vertex) const {
  S2_DCHECK_GT(num_vertices(), 0);
  // We intentionally let the (fraction >= 1) case fall through, since
  // we need to handle it in the loop below in any case because of
  // possible roundoff errors.
  if (fraction <= 0) {
    *next_vertex = 1;
    return vertex(0);
  }
  S1Angle length_sum;
  for (int i = 1; i < num_vertices(); ++i) {
    length_sum += S1Angle(vertex(i-1), vertex(i));
  }
  S1Angle target = fraction * length_sum;
  for (int i = 1; i < num_vertices(); ++i) {
    S1Angle length(vertex(i-1), vertex(i));
    if (target < length) {
      // This interpolates with respect to arc length rather than
      // straight-line distance, and produces a unit-length result.
      S2Point result = S2::InterpolateAtDistance(target, vertex(i-1),
                                                         vertex(i));
      // It is possible that (result == vertex(i)) due to rounding errors.
      *next_vertex = (result == vertex(i)) ? (i + 1) : i;
      return result;
    }
    target -= length;
  }
  *next_vertex = num_vertices();
  return vertex(num_vertices() - 1);
}